

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

CopyCounterGuy __thiscall
TestClass::SyncRetFunc5
          (TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3,CopyCounterGuy *ccg1,uint8_t *p4)

{
  char cVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  CopyCounterGuy *result;
  int __flags;
  char *in_stack_00000008;
  int local_34;
  
  __flags = (int)ccg1;
  plVar3 = (long *)CONCAT44(in_register_00000014,p2);
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 == '\0') {
    *(undefined4 *)this = 0;
    puVar2 = (undefined8 *)
             operator_new(0x58,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                          ,0x155);
    puVar2[1] = 0xfffffffb00000000;
    puVar2[2] = 0;
    *puVar2 = &PTR_onRefCountZero_00110ba8;
    puVar2[3] = p1;
    puVar2[4] = SyncRetFunc5;
    puVar2[5] = 0;
    puVar2[6] = plVar3;
    *(int *)(puVar2 + 7) = (int)p3;
    puVar2[8] = ccg1;
    puVar2[9] = p4;
    puVar2[10] = in_stack_00000008;
    SyncRetEventAgent<TestClass::CopyCounterGuy>::send
              ((SyncRetEventAgent<TestClass::CopyCounterGuy> *)&local_34,(int)puVar2,p1 + 1,
               (size_t)in_stack_00000008,__flags);
    local_34 = local_34 + 1;
  }
  else {
    *plVar3 = *plVar3 + 0x400;
    *(short *)&ccg1->mCount = (short)ccg1->mCount + 0x100;
    *in_stack_00000008 = *in_stack_00000008 + '\x10';
    local_34 = 0;
  }
  *(int *)this = local_34;
  return (CopyCounterGuy)(int)this;
}

Assistant:

CopyCounterGuy SyncRetFunc5(uint64_t& p1, uint32_t p2, uint16_t& p3, CopyCounterGuy& ccg1, uint8_t& p4)
	{
		if (not mEventThread.isThreadCurrent())
		{
			CopyCounterGuy result;
			SyncRetEventAgent5<TestClass, CopyCounterGuy, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t &>* agent =
				jh_new SyncRetEventAgent5<TestClass, CopyCounterGuy, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t&>(this, &TestClass::SyncRetFunc5,
				p1, p2, p3, ccg1, p4);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u)", result.getCount(), p1, p2, p3, ccg1.getCount(), p4);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u)", p1, p2, p3, ccg1.getCount(), p4);
		p1+=1024;
		p2+=512;
		p3+=256;
		p4+=16;
		CopyCounterGuy newGuy;
		return newGuy;
	}